

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O1

char * __thiscall cmState::GetGlobalProperty(cmState *this,string *prop)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  char *pcVar3;
  string langs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_78;
  string local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 == 0) {
    GetCacheEntryKeys_abi_cxx11_(&local_38,this);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CACHE_VARIABLES","");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_58,&local_38,";");
    cmPropertyMap::SetProperty(&this->GlobalProperties,&local_78,local_58._M_dataplus._M_p);
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)prop);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)prop);
      if (iVar2 == 0) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"IN_TRY_COMPILE","");
        pcVar3 = "0";
        if (this->IsInTryCompile != false) {
          pcVar3 = "1";
        }
        cmPropertyMap::SetProperty(&this->GlobalProperties,&local_78,pcVar3);
LAB_00266c42:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_00266c58;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)prop);
        if (iVar2 == 0) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"GENERATOR_IS_MULTI_CONFIG","");
          pcVar3 = "0";
          if (this->IsGeneratorMultiConfig != false) {
            pcVar3 = "1";
          }
          cmPropertyMap::SetProperty(&this->GlobalProperties,&local_78,pcVar3);
          goto LAB_00266c42;
        }
        iVar2 = std::__cxx11::string::compare((char *)prop);
        if (iVar2 != 0) goto LAB_00266c58;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_58,&this->EnabledLanguages,";");
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_58);
        paVar1 = &local_58.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        local_58._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"ENABLED_LANGUAGES","");
        cmPropertyMap::SetProperty(&this->GlobalProperties,&local_58,local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != paVar1) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_00266c58;
      }
      operator_delete(local_78._M_dataplus._M_p,
                      CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                               local_78.field_2._M_local_buf[0]) + 1);
      goto LAB_00266c58;
    }
    GetCommandNames_abi_cxx11_(&local_38,this);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"COMMANDS","");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_58,&local_38,";");
    cmPropertyMap::SetProperty(&this->GlobalProperties,&local_78,local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,
                    CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                             local_78.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_38);
LAB_00266c58:
  iVar2 = std::__cxx11::string::compare((char *)prop);
  if (iVar2 == 0) {
    pcVar3 = 
    "c_std_90;c_std_99;c_std_11;c_function_prototypes;c_restrict;c_static_assert;c_variadic_macros";
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)prop);
    if (iVar2 == 0) {
      pcVar3 = 
      "cxx_std_98;cxx_std_11;cxx_std_14;cxx_std_17;cxx_aggregate_default_initializers;cxx_alias_templates;cxx_alignas;cxx_alignof;cxx_attributes;cxx_attribute_deprecated;cxx_auto_type;cxx_binary_literals;cxx_constexpr;cxx_contextual_conversions;cxx_decltype;cxx_decltype_auto;cxx_decltype_incomplete_return_types;cxx_default_function_template_args;cxx_defaulted_functions;cxx_defaulted_move_initializers;cxx_delegating_constructors;cxx_deleted_functions;cxx_digit_separators;cxx_enum_forward_declarations;cxx_explicit_conversions;cxx_extended_friend_declarations;cxx_extern_templates;cxx_final;cxx_func_identifier;cxx_generalized_initializers;cxx_generic_lambdas;cxx_inheriting_constructors;cxx_inline_namespaces;cxx_lambdas;cxx_lambda_init_captures;cxx_local_type_template_args;cxx_long_long_type;cxx_noexcept;cxx_nonstatic_member_init;cxx_nullptr;cxx_override;cxx_range_for;cxx_raw_string_literals;cxx_reference_qualified_functions;cxx_relaxed_constexpr;cxx_return_type_deduction;cxx_right_angle_brackets;cxx_rvalue_references;cxx_sizeof_member;cxx_static_assert;cxx_strong_enums;cxx_template_template_parameters;cxx_thread_local;cxx_trailing_return_types;cxx_unicode_literals;cxx_uniform_initialization;cxx_unrestricted_unions;cxx_user_literals;cxx_variable_templates;cxx_variadic_macros;cxx_variadic_templates"
      ;
    }
    else {
      pcVar3 = cmPropertyMap::GetPropertyValue(&this->GlobalProperties,prop);
    }
  }
  return pcVar3;
}

Assistant:

const char* cmState::GetGlobalProperty(const std::string& prop)
{
  if (prop == "CACHE_VARIABLES") {
    std::vector<std::string> cacheKeys = this->GetCacheEntryKeys();
    this->SetGlobalProperty("CACHE_VARIABLES", cmJoin(cacheKeys, ";").c_str());
  } else if (prop == "COMMANDS") {
    std::vector<std::string> commands = this->GetCommandNames();
    this->SetGlobalProperty("COMMANDS", cmJoin(commands, ";").c_str());
  } else if (prop == "IN_TRY_COMPILE") {
    this->SetGlobalProperty("IN_TRY_COMPILE",
                            this->IsInTryCompile ? "1" : "0");
  } else if (prop == "GENERATOR_IS_MULTI_CONFIG") {
    this->SetGlobalProperty("GENERATOR_IS_MULTI_CONFIG",
                            this->IsGeneratorMultiConfig ? "1" : "0");
  } else if (prop == "ENABLED_LANGUAGES") {
    std::string langs;
    langs = cmJoin(this->EnabledLanguages, ";");
    this->SetGlobalProperty("ENABLED_LANGUAGES", langs.c_str());
  }
#define STRING_LIST_ELEMENT(F) ";" #F
  if (prop == "CMAKE_C_KNOWN_FEATURES") {
    return FOR_EACH_C_FEATURE(STRING_LIST_ELEMENT) + 1;
  }
  if (prop == "CMAKE_CXX_KNOWN_FEATURES") {
    return FOR_EACH_CXX_FEATURE(STRING_LIST_ELEMENT) + 1;
  }
#undef STRING_LIST_ELEMENT
  return this->GlobalProperties.GetPropertyValue(prop);
}